

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O2

int send_doc(curl_socket_t sock,httprequest *req)

{
  long testno;
  uint uVar1;
  __pid_t _Var2;
  int iVar3;
  ssize_t sVar4;
  char *pcVar5;
  FILE *pFVar6;
  char *pcVar7;
  size_t sVar8;
  int *piVar9;
  uint *puVar10;
  char *pcVar11;
  uint uVar12;
  size_t __n;
  char *pcVar13;
  bool bVar14;
  char *local_c0;
  char *cmd;
  int num;
  size_t count;
  size_t local_a0;
  FILE *local_98;
  size_t cmdsize;
  char partbuf [80];
  
  local_c0 = (char *)0x0;
  cmd = (char *)0x0;
  cmdsize = 0;
  pcVar13 = "log/server.response";
  if (is_proxy != '\0') {
    pcVar13 = "log/proxy.response";
  }
  if (req->rcmd == 1) {
    return 0;
  }
  if (req->rcmd == 2) {
    do {
      sVar4 = send(sock,"a string to stream 01234567890\n",0x1f,0x4000);
      if (got_exit_signal != 0) {
        return -1;
      }
    } while (sVar4 == 0x1f);
    logmsg("Stopped streaming");
    return -1;
  }
  req->open = false;
  testno = req->testno;
  if (testno < 0) {
    if (testno == -2) {
      logmsg("Identifying ourselves as friends");
      _Var2 = getpid();
      curl_msnprintf(partbuf,0x40,"WE ROOLZ: %ld\r\n",(long)_Var2);
      if (use_gopher == 1) {
        pcVar11 = send_doc::weare;
        curl_msnprintf(send_doc::weare,0x100,"%s",partbuf);
      }
      else {
        pcVar11 = send_doc::weare;
        sVar8 = strlen(partbuf);
        curl_msnprintf(send_doc::weare,0x100,"HTTP/1.1 200 OK\r\nContent-Length: %zu\r\n\r\n%s",
                       sVar8,partbuf);
      }
    }
    else if (testno == -3) {
      logmsg("Replying to QUIT");
      pcVar11 = "HTTP/1.1 200 Goodbye\r\n\r\n";
    }
    else {
      logmsg("Replying to with a 404");
      pcVar11 = 
      "HTTP/1.1 404 Not Found\r\nServer: curl test suite HTTP server/0.1\r\nConnection: close\r\nContent-Type: text/html\r\n\r\n<!DOCTYPE HTML PUBLIC \"-//IETF//DTD HTML 2.0//EN\">\n<HTML><HEAD>\n<TITLE>404 Not Found</TITLE>\n</HEAD><BODY>\n<H1>Not Found</H1>\nThe requested URL was not found on this server.\n<P><HR><ADDRESS>curl test suite HTTP server/0.1</ADDRESS>\n</BODY></HTML>\n"
      ;
    }
    count = strlen(pcVar11);
  }
  else {
    pcVar5 = test2file(testno);
    pcVar11 = "data";
    if (req->connect_request != false) {
      pcVar11 = "connect";
    }
    if (req->partno == 0) {
      curl_msnprintf(partbuf,0x50,"%s",pcVar11);
    }
    else {
      curl_msnprintf(partbuf,0x50,"%s%ld",pcVar11);
    }
    logmsg("Send response test%ld section <%s>",req->testno,partbuf);
    pFVar6 = fopen64(pcVar5,"rb");
    if (pFVar6 == (FILE *)0x0) {
      puVar10 = (uint *)__errno_location();
      uVar1 = *puVar10;
      pcVar13 = strerror(uVar1);
      logmsg("fopen() failed with error: %d %s",(ulong)uVar1,pcVar13);
      logmsg("  [3] Error opening file: %s",pcVar5);
      return 0;
    }
    uVar1 = getpart(&local_c0,&count,"reply",partbuf,(FILE *)pFVar6);
    fclose(pFVar6);
    pcVar11 = local_c0;
    if (uVar1 != 0) {
      logmsg("getpart() failed with error: %d",(ulong)uVar1);
      return 0;
    }
    if (got_exit_signal != 0) goto LAB_00107b33;
    pFVar6 = fopen64(pcVar5,"rb");
    if (pFVar6 == (FILE *)0x0) {
      puVar10 = (uint *)__errno_location();
      uVar1 = *puVar10;
      pcVar13 = strerror(uVar1);
      logmsg("fopen() failed with error: %d %s",(ulong)uVar1,pcVar13);
      logmsg("  [4] Error opening file: %s",pcVar5);
LAB_00107f3b:
      free(local_c0);
      return 0;
    }
    uVar1 = getpart(&cmd,&cmdsize,"reply","postcmd",(FILE *)pFVar6);
    fclose(pFVar6);
    if (uVar1 != 0) {
      logmsg("getpart() failed with error: %d",(ulong)uVar1);
      goto LAB_00107f3b;
    }
  }
  if (got_exit_signal == 0) {
    pcVar5 = strstr(pcVar11,"swsclose");
    bVar14 = count != 0;
    if (!bVar14 || pcVar5 != (char *)0x0) {
      logmsg("connection close instruction \"swsclose\" found in response");
    }
    pcVar7 = strstr(pcVar11,"swsbounce");
    if (pcVar7 == (char *)0x0) {
      prevbounce = 0;
    }
    else {
      prevbounce = 1;
      logmsg("enable \"swsbounce\" in the next request");
    }
    pFVar6 = fopen64(pcVar13,"ab");
    if (pFVar6 == (FILE *)0x0) {
      puVar10 = (uint *)__errno_location();
      uVar1 = *puVar10;
      pcVar11 = strerror(uVar1);
      logmsg("fopen() failed with error: %d %s",(ulong)uVar1,pcVar11);
      logmsg("  [5] Error opening file: %s",pcVar13);
    }
    else {
      local_a0 = count;
      local_98 = pFVar6;
      do {
        __n = count;
        if (199 < count) {
          __n = 200;
        }
        while (sVar8 = send(sock,pcVar11,__n,0x4000), (long)sVar8 < 0) {
          piVar9 = __errno_location();
          pFVar6 = local_98;
          if (*piVar9 != 0xb) goto LAB_00107d11;
          wait_ms(10);
        }
        logmsg("Sent off %zd bytes",sVar8);
        fwrite(pcVar11,1,sVar8,local_98);
        count = count - sVar8;
        if (req->writedelay != 0) {
          iVar3 = req->writedelay * 4;
          logmsg("Pausing %d seconds");
          while ((0 < iVar3 && (got_exit_signal == 0))) {
            iVar3 = iVar3 + -1;
            wait_ms(0xfa);
          }
        }
        pFVar6 = local_98;
      } while (((-1 < (long)sVar8) && (count != 0)) &&
              (pcVar11 = pcVar11 + sVar8, got_exit_signal == 0));
LAB_00107d11:
      do {
        iVar3 = fclose(pFVar6);
        if (iVar3 == 0) goto LAB_00107d46;
        puVar10 = (uint *)__errno_location();
        uVar1 = *puVar10;
      } while (uVar1 == 4);
      pcVar11 = strerror(uVar1);
      logmsg("Error closing file %s error: %d %s",pcVar13,(ulong)uVar1,pcVar11);
LAB_00107d46:
      if (got_exit_signal == 0) {
        if (-1 < (long)sVar8) {
          logmsg("Response sent (%zu bytes) and written to %s",local_a0,pcVar13);
          free(local_c0);
          if (cmdsize != 0) {
            local_c0 = cmd;
            do {
              iVar3 = __isoc99_sscanf(local_c0,"%31s %d",partbuf,&num);
              if (iVar3 == 2) {
                iVar3 = bcmp("wait",partbuf,5);
                if (iVar3 == 0) {
                  logmsg("Told to sleep for %d seconds",(ulong)(uint)num);
                  uVar12 = num << 2;
                  uVar1 = (int)uVar12 >> 0x1f & uVar12;
                  do {
                    if ((int)uVar12 < 1) goto LAB_00107e52;
                    if (got_exit_signal != 0) goto LAB_00107e69;
                    uVar12 = uVar12 - 1;
                    iVar3 = wait_ms(0xfa);
                  } while (iVar3 == 0);
                  puVar10 = (uint *)__errno_location();
                  uVar1 = *puVar10;
                  pcVar13 = strerror(uVar1);
                  logmsg("wait_ms() failed with error: (%d) %s",(ulong)uVar1,pcVar13);
                  uVar1 = uVar12;
LAB_00107e52:
                  if (uVar1 == 0) {
                    logmsg("Continuing after sleeping %d seconds",(ulong)(uint)num);
                  }
                }
                else {
                  logmsg("Unknown command in reply command section");
                }
              }
LAB_00107e69:
              local_c0 = strchr(local_c0,10);
              pcVar13 = local_c0 + 1;
            } while ((local_c0 != (char *)0x0) && (local_c0 = pcVar13, *pcVar13 != '\0'));
          }
          free(cmd);
          req->open = (_Bool)((bVar14 && pcVar5 == (char *)0x0) & (use_gopher ^ 1));
          prevtestno = req->testno;
          prevpartno = req->partno;
          return 0;
        }
        logmsg("Sending response failed. Only (%zu bytes) of (%zu bytes) were sent",local_a0 - count
              );
      }
    }
  }
  free(local_c0);
  pcVar11 = cmd;
LAB_00107b33:
  free(pcVar11);
  return -1;
}

Assistant:

static int send_doc(curl_socket_t sock, struct httprequest *req)
{
  ssize_t written;
  size_t count;
  const char *buffer;
  char *ptr=NULL;
  FILE *stream;
  char *cmd=NULL;
  size_t cmdsize=0;
  FILE *dump;
  bool persistant = TRUE;
  bool sendfailure = FALSE;
  size_t responsesize;
  int error = 0;
  int res;
  const char *responsedump = is_proxy?RESPONSE_PROXY_DUMP:RESPONSE_DUMP;
  static char weare[256];

  switch(req->rcmd) {
  default:
  case RCMD_NORMALREQ:
    break; /* continue with business as usual */
  case RCMD_STREAM:
#define STREAMTHIS "a string to stream 01234567890\n"
    count = strlen(STREAMTHIS);
    for(;;) {
      written = swrite(sock, STREAMTHIS, count);
      if(got_exit_signal)
        return -1;
      if(written != (ssize_t)count) {
        logmsg("Stopped streaming");
        break;
      }
    }
    return -1;
  case RCMD_IDLE:
    /* Do nothing. Sit idle. Pretend it rains. */
    return 0;
  }

  req->open = FALSE;

  if(req->testno < 0) {
    size_t msglen;
    char msgbuf[64];

    switch(req->testno) {
    case DOCNUMBER_QUIT:
      logmsg("Replying to QUIT");
      buffer = docquit;
      break;
    case DOCNUMBER_WERULEZ:
      /* we got a "friends?" question, reply back that we sure are */
      logmsg("Identifying ourselves as friends");
      snprintf(msgbuf, sizeof(msgbuf), "WE ROOLZ: %ld\r\n", (long)getpid());
      msglen = strlen(msgbuf);
      if(use_gopher)
        snprintf(weare, sizeof(weare), "%s", msgbuf);
      else
        snprintf(weare, sizeof(weare),
                 "HTTP/1.1 200 OK\r\nContent-Length: %zu\r\n\r\n%s",
                 msglen, msgbuf);
      buffer = weare;
      break;
    case DOCNUMBER_404:
    default:
      logmsg("Replying to with a 404");
      buffer = doc404;
      break;
    }

    count = strlen(buffer);
  }
  else {
    char partbuf[80];
    char *filename = test2file(req->testno);

    /* select the <data> tag for "normal" requests and the <connect> one
       for CONNECT requests (within the <reply> section) */
    const char *section= req->connect_request?"connect":"data";

    if(req->partno)
      snprintf(partbuf, sizeof(partbuf), "%s%ld", section, req->partno);
    else
      snprintf(partbuf, sizeof(partbuf), "%s", section);

    logmsg("Send response test%ld section <%s>", req->testno, partbuf);

    stream=fopen(filename, "rb");
    if(!stream) {
      error = errno;
      logmsg("fopen() failed with error: %d %s", error, strerror(error));
      logmsg("  [3] Error opening file: %s", filename);
      return 0;
    }
    else {
      error = getpart(&ptr, &count, "reply", partbuf, stream);
      fclose(stream);
      if(error) {
        logmsg("getpart() failed with error: %d", error);
        return 0;
      }
      buffer = ptr;
    }

    if(got_exit_signal) {
      free(ptr);
      return -1;
    }

    /* re-open the same file again */
    stream=fopen(filename, "rb");
    if(!stream) {
      error = errno;
      logmsg("fopen() failed with error: %d %s", error, strerror(error));
      logmsg("  [4] Error opening file: %s", filename);
      free(ptr);
      return 0;
    }
    else {
      /* get the custom server control "commands" */
      error = getpart(&cmd, &cmdsize, "reply", "postcmd", stream);
      fclose(stream);
      if(error) {
        logmsg("getpart() failed with error: %d", error);
        free(ptr);
        return 0;
      }
    }
  }

  if(got_exit_signal) {
    free(ptr);
    free(cmd);
    return -1;
  }

  /* If the word 'swsclose' is present anywhere in the reply chunk, the
     connection will be closed after the data has been sent to the requesting
     client... */
  if(strstr(buffer, "swsclose") || !count) {
    persistant = FALSE;
    logmsg("connection close instruction \"swsclose\" found in response");
  }
  if(strstr(buffer, "swsbounce")) {
    prevbounce = TRUE;
    logmsg("enable \"swsbounce\" in the next request");
  }
  else
    prevbounce = FALSE;

  dump = fopen(responsedump, "ab");
  if(!dump) {
    error = errno;
    logmsg("fopen() failed with error: %d %s", error, strerror(error));
    logmsg("  [5] Error opening file: %s", responsedump);
    free(ptr);
    free(cmd);
    return -1;
  }

  responsesize = count;
  do {
    /* Ok, we send no more than 200 bytes at a time, just to make sure that
       larger chunks are split up so that the client will need to do multiple
       recv() calls to get it and thus we exercise that code better */
    size_t num = count;
    if(num > 200)
      num = 200;

    retry:
    written = swrite(sock, buffer, num);
    if(written < 0) {
      if((EWOULDBLOCK == SOCKERRNO) || (EAGAIN == SOCKERRNO)) {
        wait_ms(10);
        goto retry;
      }
      sendfailure = TRUE;
      break;
    }
    else {
      logmsg("Sent off %zd bytes", written);
    }

    /* write to file as well */
    fwrite(buffer, 1, (size_t)written, dump);

    count -= written;
    buffer += written;

    if(req->writedelay) {
      int quarters = req->writedelay * 4;
      logmsg("Pausing %d seconds", req->writedelay);
      while((quarters > 0) && !got_exit_signal) {
        quarters--;
        wait_ms(250);
      }
    }
  } while((count > 0) && !got_exit_signal);

  do {
    res = fclose(dump);
  } while(res && ((error = errno) == EINTR));
  if(res)
    logmsg("Error closing file %s error: %d %s",
           responsedump, error, strerror(error));

  if(got_exit_signal) {
    free(ptr);
    free(cmd);
    return -1;
  }

  if(sendfailure) {
    logmsg("Sending response failed. Only (%zu bytes) of (%zu bytes) "
           "were sent",
           responsesize-count, responsesize);
    free(ptr);
    free(cmd);
    return -1;
  }

  logmsg("Response sent (%zu bytes) and written to %s",
         responsesize, responsedump);
  free(ptr);

  if(cmdsize > 0) {
    char command[32];
    int quarters;
    int num;
    ptr=cmd;
    do {
      if(2 == sscanf(ptr, "%31s %d", command, &num)) {
        if(!strcmp("wait", command)) {
          logmsg("Told to sleep for %d seconds", num);
          quarters = num * 4;
          while((quarters > 0) && !got_exit_signal) {
            quarters--;
            res = wait_ms(250);
            if(res) {
              /* should not happen */
              error = errno;
              logmsg("wait_ms() failed with error: (%d) %s",
                     error, strerror(error));
              break;
            }
          }
          if(!quarters)
            logmsg("Continuing after sleeping %d seconds", num);
        }
        else
          logmsg("Unknown command in reply command section");
      }
      ptr = strchr(ptr, '\n');
      if(ptr)
        ptr++;
      else
        ptr = NULL;
    } while(ptr && *ptr);
  }
  free(cmd);
  req->open = use_gopher?FALSE:persistant;

  prevtestno = req->testno;
  prevpartno = req->partno;

  return 0;
}